

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_common.c
# Opt level: O2

void on_device_state_changed_callback
               (void *context,DEVICE_STATE previous_state,DEVICE_STATE new_state)

{
  int iVar1;
  time_t tVar2;
  code *UNRECOVERED_JUMPTABLE;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uStack_20;
  
  if (new_state == previous_state || context == (void *)0x0) {
    return;
  }
  *(DEVICE_STATE *)((long)context + 0x20) = new_state;
  tVar2 = get_time((time_t *)0x0);
  *(time_t *)((long)context + 0x38) = tVar2;
  if (new_state == DEVICE_STATE_STOPPED) {
    iVar1 = *(int *)(*(long *)((long)context + 0x10) + 0x40);
    if ((iVar1 == 8) || (iVar1 == 3)) {
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x68);
      uVar3 = *(undefined8 *)((long)context + 0xa0);
      uStack_20 = 6;
    }
    else {
      if (*(char *)((long)context + 0x52) != '\x01') {
        return;
      }
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x68);
      uVar3 = *(undefined8 *)((long)context + 0xa0);
      uStack_20 = 8;
    }
  }
  else if (new_state == DEVICE_STATE_ERROR_AUTH) {
    UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x68);
    uVar3 = *(undefined8 *)((long)context + 0xa0);
    uStack_20 = 2;
  }
  else {
    if (new_state == DEVICE_STATE_STARTED) {
      retry_control_reset(*(RETRY_CONTROL_HANDLE *)(*(long *)((long)context + 0x10) + 0x48));
      UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x68);
      uVar3 = *(undefined8 *)((long)context + 0xa0);
      uStack_20 = 6;
      uVar4 = 0;
      goto LAB_0012eead;
    }
    if (1 < new_state - DEVICE_STATE_ERROR_AUTH_TIMEOUT) {
      return;
    }
    UNRECOVERED_JUMPTABLE = *(code **)((long)context + 0x68);
    uVar3 = *(undefined8 *)((long)context + 0xa0);
    uStack_20 = 5;
  }
  uVar4 = 1;
LAB_0012eead:
  (*UNRECOVERED_JUMPTABLE)(uVar4,uStack_20,uVar3);
  return;
}

Assistant:

static void on_device_state_changed_callback(void* context, DEVICE_STATE previous_state, DEVICE_STATE new_state)
{
    if (context != NULL && new_state != previous_state)
    {
        AMQP_TRANSPORT_DEVICE_INSTANCE* registered_device = (AMQP_TRANSPORT_DEVICE_INSTANCE*)context;
        registered_device->device_state = new_state;
        registered_device->time_of_last_state_change = get_time(NULL);

        if (new_state == DEVICE_STATE_STARTED)
        {
            reset_retry_control(registered_device);

            registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_AUTHENTICATED, IOTHUB_CLIENT_CONNECTION_OK, registered_device->transport_ctx);
        }
        else if (new_state == DEVICE_STATE_STOPPED)
        {
            if (registered_device->transport_instance->state == AMQP_TRANSPORT_STATE_CONNECTED ||
                registered_device->transport_instance->state == AMQP_TRANSPORT_STATE_BEING_DESTROYED)
            {
                registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_OK, registered_device->transport_ctx);
            }
            else if (registered_device->is_quota_exceeded)
            {
                registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_QUOTA_EXCEEDED, registered_device->transport_ctx);
            }
        }
        else if (new_state == DEVICE_STATE_ERROR_AUTH)
        {
            registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_BAD_CREDENTIAL, registered_device->transport_ctx);
        }
        else if (new_state == DEVICE_STATE_ERROR_AUTH_TIMEOUT || new_state == DEVICE_STATE_ERROR_MSG)
        {
            registered_device->transport_callbacks.connection_status_cb(IOTHUB_CLIENT_CONNECTION_UNAUTHENTICATED, IOTHUB_CLIENT_CONNECTION_COMMUNICATION_ERROR, registered_device->transport_ctx);
        }
    }
}